

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O2

TwoLevelStatus __thiscall
JPEGImageParser::ReadStreamToBuffer
          (JPEGImageParser *this,unsigned_long inAmountToRead,unsigned_long *refReadLimit)

{
  EStatusCode EVar1;
  TwoLevelStatus TVar2;
  TwoLevelStatus TVar3;
  
  if (*refReadLimit < inAmountToRead) {
    TVar2.primary = eSuccess;
    TVar2.secondary = eFailure;
    return TVar2;
  }
  EVar1 = ReadStreamToBuffer(this,inAmountToRead);
  TVar3.primary = eFailure;
  TVar3.secondary = eSuccess;
  if (EVar1 == eSuccess) {
    *refReadLimit = *refReadLimit - inAmountToRead;
    TVar3.primary = eSuccess;
    TVar3.secondary = eSuccess;
  }
  return TVar3;
}

Assistant:

TwoLevelStatus JPEGImageParser::ReadStreamToBuffer(unsigned long inAmountToRead,unsigned long& refReadLimit)
{
	if (refReadLimit < inAmountToRead)
		return TwoLevelStatus(PDFHummus::eSuccess, PDFHummus::eFailure);
	EStatusCode status = ReadStreamToBuffer(inAmountToRead);
	if (status == PDFHummus::eSuccess)
		refReadLimit -= inAmountToRead;
	return TwoLevelStatus(status, PDFHummus::eSuccess);
}